

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.hpp
# Opt level: O2

float EDX::Smith_G1(vec3f v,vec3f wm,float alpha)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  fVar5 = wm.z;
  fVar3 = wm.x;
  fVar4 = wm.y;
  fVar2 = v.z;
  fVar6 = -fVar5;
  if (fVar5 < fVar6) {
    fVar3 = -fVar3;
    fVar4 = -fVar4;
  }
  fVar7 = 1.0;
  fVar1 = 1.0 - fVar2 * fVar2;
  if (0.0 < fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar7 = 1.0;
    fVar1 = fVar1 / fVar2;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      if (fVar6 <= fVar5) {
        fVar6 = fVar5;
      }
      fVar7 = 0.0;
      if (0.0 < (fVar6 * fVar2 + fVar3 * v.x + v.y * fVar4) * fVar2) {
        fVar7 = 2.0 / (SQRT(ABS(fVar1) * alpha * ABS(fVar1) * alpha + 1.0) + 1.0);
      }
    }
  }
  return fVar7;
}

Assistant:

inline float Smith_G1(vec3f v, vec3f wm, float alpha)
{
    if (wm.z < 0) wm = -wm;

    float tanTheta = fabs(TanTheta(v));

    if (tanTheta == 0.0f)
        return 1.0f;

    if (dot(v, wm) * CosTheta(v) <= 0)
        return 0.0f;

    float root = alpha * tanTheta;
    return 2.0f / (1.0f + sqrtf(1.0f + root*root));
}